

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O2

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_max_op<double,_double>,_Eigen::internal::redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>,_3,_0>
       ::run(redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
             *mat,scalar_max_op<double,_double> *func)

{
  long lVar1;
  double *pdVar2;
  long lVar3;
  Index index;
  Index IVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  
  lVar1 = (mat->m_xpr->
          super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
          ).super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
          .
          super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
          .m_rows.m_value;
  IVar4 = first_aligned_impl<16,_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_false>
          ::run(mat->m_xpr);
  lVar6 = lVar1 - IVar4;
  pdVar2 = (mat->m_evaluator).
           super_block_evaluator<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
           super_mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
           .m_data;
  if (lVar6 + 1U < 3) {
    dVar9 = *pdVar2;
    for (lVar6 = 1; lVar6 < lVar1; lVar6 = lVar6 + 1) {
      dVar10 = pdVar2[lVar6];
      if (pdVar2[lVar6] <= dVar9) {
        dVar10 = dVar9;
      }
      dVar9 = dVar10;
    }
  }
  else {
    auVar8 = *(undefined1 (*) [16])(pdVar2 + IVar4);
    if (3 < lVar6) {
      lVar5 = IVar4 + (lVar6 / 4) * 4;
      auVar11 = *(undefined1 (*) [16])(pdVar2 + IVar4 + 2);
      lVar3 = IVar4;
      while (lVar7 = lVar3 + 4, lVar7 < lVar5) {
        auVar8 = maxpd(auVar8,*(undefined1 (*) [16])(pdVar2 + lVar7));
        auVar11 = maxpd(auVar11,*(undefined1 (*) [16])(pdVar2 + lVar3 + 6));
        lVar3 = lVar7;
      }
      auVar8 = maxpd(auVar8,auVar11);
      if ((lVar6 / 4) * 4 < (lVar6 / 2) * 2) {
        auVar8 = maxpd(auVar8,*(undefined1 (*) [16])(pdVar2 + lVar5));
      }
    }
    lVar6 = IVar4 + (lVar6 / 2) * 2;
    if (auVar8._0_8_ <= auVar8._8_8_) {
      auVar8._0_8_ = auVar8._8_8_;
    }
    lVar5 = 0;
    if (IVar4 < 1) {
      IVar4 = lVar5;
    }
    for (; IVar4 != lVar5; lVar5 = lVar5 + 1) {
      dVar9 = pdVar2[lVar5];
      if (pdVar2[lVar5] <= auVar8._0_8_) {
        dVar9 = auVar8._0_8_;
      }
      auVar8._8_8_ = 0.0;
      auVar8._0_8_ = dVar9;
    }
    for (; dVar9 = auVar8._0_8_, lVar6 < lVar1; lVar6 = lVar6 + 1) {
      dVar10 = pdVar2[lVar6];
      if (pdVar2[lVar6] <= dVar9) {
        dVar10 = dVar9;
      }
      auVar8._8_8_ = 0.0;
      auVar8._0_8_ = dVar10;
    }
  }
  return dVar9;
}

Assistant:

static Scalar run(const Derived &mat, const Func& func)
  {
    const Index size = mat.size();
    
    const Index packetSize = redux_traits<Func, Derived>::PacketSize;
    const int packetAlignment = unpacket_traits<PacketScalar>::alignment;
    enum {
      alignment0 = (bool(Derived::Flags & DirectAccessBit) && bool(packet_traits<Scalar>::AlignedOnScalar)) ? int(packetAlignment) : int(Unaligned),
      alignment = EIGEN_PLAIN_ENUM_MAX(alignment0, Derived::Alignment)
    };
    const Index alignedStart = internal::first_default_aligned(mat.nestedExpression());
    const Index alignedSize2 = ((size-alignedStart)/(2*packetSize))*(2*packetSize);
    const Index alignedSize = ((size-alignedStart)/(packetSize))*(packetSize);
    const Index alignedEnd2 = alignedStart + alignedSize2;
    const Index alignedEnd  = alignedStart + alignedSize;
    Scalar res;
    if(alignedSize)
    {
      PacketScalar packet_res0 = mat.template packet<alignment,PacketScalar>(alignedStart);
      if(alignedSize>packetSize) // we have at least two packets to partly unroll the loop
      {
        PacketScalar packet_res1 = mat.template packet<alignment,PacketScalar>(alignedStart+packetSize);
        for(Index index = alignedStart + 2*packetSize; index < alignedEnd2; index += 2*packetSize)
        {
          packet_res0 = func.packetOp(packet_res0, mat.template packet<alignment,PacketScalar>(index));
          packet_res1 = func.packetOp(packet_res1, mat.template packet<alignment,PacketScalar>(index+packetSize));
        }

        packet_res0 = func.packetOp(packet_res0,packet_res1);
        if(alignedEnd>alignedEnd2)
          packet_res0 = func.packetOp(packet_res0, mat.template packet<alignment,PacketScalar>(alignedEnd2));
      }
      res = func.predux(packet_res0);

      for(Index index = 0; index < alignedStart; ++index)
        res = func(res,mat.coeff(index));

      for(Index index = alignedEnd; index < size; ++index)
        res = func(res,mat.coeff(index));
    }
    else // too small to vectorize anything.
         // since this is dynamic-size hence inefficient anyway for such small sizes, don't try to optimize.
    {
      res = mat.coeff(0);
      for(Index index = 1; index < size; ++index)
        res = func(res,mat.coeff(index));
    }

    return res;
  }